

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_closure.cpp
# Opt level: O0

void __thiscall main::f::exec(f *this)

{
  f *this_local;
  
  printf("ref.total %d i %d\n",(ulong)(uint)*(this->ref).total,(ulong)(uint)this->i);
  pthread_mutex_lock((pthread_mutex_t *)(this->ref).m);
  std::vector<int,_std::allocator<int>_>::push_back((this->ref).v2,&this->i);
  pthread_mutex_unlock((pthread_mutex_t *)(this->ref).m);
  return;
}

Assistant:

co_func( f,ref,i )
		{
			printf("ref.total %d i %d\n",ref.total,i );
			//lock
			pthread_mutex_lock(&ref.m);
			ref.v2.push_back( i );
			pthread_mutex_unlock(&ref.m);
			//unlock
		}